

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap.h
# Opt level: O0

void __thiscall
snmalloc::
FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
::register_range(FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
                 *this,address_t p,size_t length)

{
  long lVar1;
  size_t size;
  unsigned_long uVar2;
  void *p_00;
  long in_RDX;
  ulong in_RSI;
  long *in_RDI;
  size_t using_size;
  char *page_end;
  char *page_start;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *last;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *first;
  void *p_01;
  
  lVar1 = *in_RDI;
  p_01 = (void *)*in_RDI;
  size = in_RSI + in_RDX;
  uVar2 = bits::one_at_bit<unsigned_long,unsigned_long>(0xe);
  p_00 = (void *)(lVar1 + (in_RSI >> 0xe) * 0x10 & 0xfffffffffffff000);
  PALPOSIX<snmalloc::PALLinux,_&writev,_&fsync>::notify_using<(snmalloc::ZeroMem)0>
            (p_00,((long)p_01 + ((size + uVar2) - 1 >> 0xe) * 0x10 + 0xfff & 0xfffffffffffff000) -
                  (long)p_00);
  PALLinux::notify_do_dump(p_01,size);
  return;
}

Assistant:

void register_range(address_t p, size_t length)
    {
      SNMALLOC_ASSERT(is_initialised());

      if constexpr (has_bounds)
      {
        if ((p - base >= size) || (p + length - base > size))
        {
          PAL::error("Internal error: Pagemap registering out of range.");
        }
        p = p - base;
      }

      // Calculate range in pagemap that is associated to this space.
      auto first = &body[p >> SHIFT];
      auto last = &body[(p + length + bits::one_at_bit(SHIFT) - 1) >> SHIFT];

      // Commit OS pages associated to the range.
      auto page_start = pointer_align_down<OS_PAGE_SIZE, char>(first);
      auto page_end = pointer_align_up<OS_PAGE_SIZE, char>(last);
      size_t using_size = pointer_diff(page_start, page_end);
      PAL::template notify_using<NoZero>(page_start, using_size);
      if constexpr (pal_supports<CoreDump, PAL>)
      {
        PAL::notify_do_dump(page_start, using_size);
      }
    }